

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<int>::move(QList<int> *this,qsizetype from,qsizetype to)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  
  if (from == to) {
    return;
  }
  detach(this);
  piVar3 = (this->d).ptr;
  if (from < to) {
    lVar1 = from * 4;
    piVar4 = piVar3 + from + 1;
    lVar2 = to * 4;
  }
  else {
    lVar1 = to * 4;
    piVar4 = piVar3 + from;
    lVar2 = from * 4;
  }
  std::_V2::__rotate<int*>((long)piVar3 + lVar1,piVar4,(long)piVar3 + lVar2 + 4);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }